

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcBinaryStream.h
# Opt level: O0

unsigned_long __thiscall
o3dgc::BinaryStream::ReadUIntASCII(BinaryStream *this,unsigned_long *position)

{
  unsigned_long uVar1;
  byte bVar2;
  byte *pbVar3;
  unsigned_long i;
  long x;
  unsigned_long value;
  unsigned_long *position_local;
  BinaryStream *this_local;
  
  uVar1 = *position;
  *position = uVar1 + 1;
  pbVar3 = Vector<unsigned_char>::operator[](&this->m_stream,uVar1);
  x = (long)*pbVar3;
  if (x == 0x7f) {
    bVar2 = 0;
    x = 0x7f;
    do {
      uVar1 = *position;
      *position = uVar1 + 1;
      pbVar3 = Vector<unsigned_char>::operator[](&this->m_stream,uVar1);
      x = (((long)(ulong)*pbVar3 >> 1) << (bVar2 & 0x3f)) + x;
      bVar2 = bVar2 + 6;
    } while ((*pbVar3 & 1) != 0);
  }
  return x;
}

Assistant:

unsigned long           ReadUIntASCII(unsigned long & position) const
                                {
                                    unsigned long value = m_stream[position++];
                                    if (value == O3DGC_BINARY_STREAM_MAX_SYMBOL0)
                                    {
                                        long x;
                                        unsigned long i = 0;
                                        do
                                        {
                                            x = m_stream[position++];
                                            value += ( (x>>1) << i);
                                            i += O3DGC_BINARY_STREAM_BITS_PER_SYMBOL1;
                                        } while (x & 1);
                                    }
                                    return value;
                                }